

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.upb.h
# Opt level: O0

google_protobuf_MessageOptions *
google_protobuf_MessageOptions_parse(char *buf,size_t size,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  google_protobuf_MessageOptions *ret;
  upb_Arena *arena_local;
  size_t size_local;
  char *buf_local;
  
  buf_local = (char *)google_protobuf_MessageOptions_new(arena);
  if ((google_protobuf_MessageOptions *)buf_local == (google_protobuf_MessageOptions *)0x0) {
    buf_local = (char *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,(upb_Message *)buf_local,&google__protobuf__MessageOptions_msg_init,
                       (upb_ExtensionRegistry *)0x0,0,arena);
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      buf_local = (char *)0x0;
    }
  }
  return (google_protobuf_MessageOptions *)buf_local;
}

Assistant:

UPB_INLINE google_protobuf_MessageOptions* google_protobuf_MessageOptions_parse(const char* buf, size_t size, upb_Arena* arena) {
  google_protobuf_MessageOptions* ret = google_protobuf_MessageOptions_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &google__protobuf__MessageOptions_msg_init, NULL, 0, arena) !=
      kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}